

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O3

int CVmObjList::getp_count_which(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *argc)

{
  ushort uVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  int iVar5;
  vm_obj_id_t vVar6;
  ulong uVar7;
  vm_val_t *funcptr;
  vm_rcdesc rc;
  vm_rcdesc local_78;
  
  if (getp_count_which(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    getp_count_which();
  }
  iVar5 = CVmObject::get_prop_check_argc(retval,argc,&getp_count_which::desc);
  if (iVar5 == 0) {
    funcptr = sp_ + -1;
    vVar6 = 0;
    vm_rcdesc::init(&local_78,(EVP_PKEY_CTX *)"List.countWhich");
    pvVar4 = sp_;
    uVar3 = *(undefined4 *)&self_val->field_0x4;
    aVar2 = self_val->val;
    sp_ = sp_ + 1;
    pvVar4->typ = self_val->typ;
    *(undefined4 *)&pvVar4->field_0x4 = uVar3;
    pvVar4->val = aVar2;
    uVar1 = *(ushort *)lst;
    retval->typ = VM_NIL;
    if ((ulong)uVar1 != 0) {
      uVar7 = 0;
      vVar6 = 0;
      do {
        pvVar4 = sp_;
        sp_ = sp_ + 1;
        index_list(pvVar4,lst,(int)uVar7 + 1);
        CVmRun::call_func_ptr(&G_interpreter_X,funcptr,1,&local_78,0);
        if ((r0_.typ != VM_NIL) && ((r0_.typ != VM_INT || (r0_.val.obj != 0)))) {
          vVar6 = vVar6 + 1;
        }
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
    }
    sp_ = sp_ + -2;
    retval->typ = VM_INT;
    (retval->val).obj = vVar6;
  }
  return 1;
}

Assistant:

int CVmObjList::getp_count_which(VMG_ vm_val_t *retval,
                                 const vm_val_t *self_val,
                                 const char *lst, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the function pointer argument, but leave it on the stack */
    const vm_val_t *func_val = G_stk->get(0);

    /* set up a native callback descriptor */
    vm_rcdesc rc(vmg_ "List.countWhich", self_val, 16, G_stk->get(0), argc);

    /* push a self-reference while allocating to protect from gc */
    G_stk->push(self_val);

    /* get the length of the list */
    size_t cnt = vmb_get_len(lst);

    /* no return value */
    retval->set_nil();

    /* invoke the callback on each element */
    size_t idx;
    int val_cnt;
    for (idx = 1, val_cnt = 0 ; idx <= cnt ; ++idx)
    {
        vm_val_t *val;

        /* re-translate the list address in case of swapping */
        VM_IF_SWAPPING_POOL(if (self_val->typ == VM_LIST)
            lst = self_val->get_as_list(vmg0_);)

        /* 
         *   get this element (using a 1-based index), and push it as the
         *   callback's argument 
         */
        index_and_push(vmg_ lst, idx);

        /* invoke the callback */
        G_interpreter->call_func_ptr(vmg_ func_val, 1, &rc, 0);

        /* get the result from R0 */
        val = G_interpreter->get_r0();

        /* if the callback returned non-nil and non-zero, count it */
        if (val->typ == VM_NIL
            || (val->typ == VM_INT && val->val.intval == 0))
        {
            /* it's nil or zero - don't include it in the result */
        }
        else
        {
            /* count it */
            ++val_cnt;
        }
    }

    /* discard our gc protection (self) and our arguments */
    G_stk->discard(2);

    /* return the count */
    retval->set_int(val_cnt);

    /* handled */
    return TRUE;
}